

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header6.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Header6::Header6
          (Header6 *this,ProtocolVersion PV,KUINT8 ExerciseID,PDUType PT,ProtocolFamily PF,
          TimeStamp *TS,KUINT16 PDULength)

{
  this->_vptr_Header6 = (_func_int **)&PTR__Header6_00320150;
  this->m_ui8ProtocolVersion = (KUINT8)PV;
  this->m_ui8ExerciseID = ExerciseID;
  this->m_ui8PDUType = (KUINT8)PT;
  this->m_ui8ProtocolFamily = (KUINT8)PF;
  (this->m_TimeStamp).super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__TimeStamp_00310b68
  ;
  (this->m_TimeStamp).m_TimeStampUnion = TS->m_TimeStampUnion;
  (this->m_TimeStamp).m_bAutoCalcRel = TS->m_bAutoCalcRel;
  this->m_ui16PDULength = PDULength;
  this->m_ui8Padding1 = '\0';
  this->m_ui8Padding2 = '\0';
  return;
}

Assistant:

Header6::Header6( ProtocolVersion PV, KUINT8 ExerciseID, PDUType PT, ProtocolFamily PF, const TimeStamp & TS, KUINT16 PDULength ) :
    m_ui8ProtocolVersion( PV ),
    m_ui8ExerciseID( ExerciseID ),
    m_ui8PDUType( PT ),
    m_ui8ProtocolFamily( PF ),
    m_TimeStamp( TS ),
    m_ui16PDULength( PDULength ),
    m_ui8Padding1( 0 ),
    m_ui8Padding2( 0 )
{
}